

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O2

uint8_t setupRI(uint8_t rtype,ELF2vlink *convert,RelocInsert *ri1,RelocInsert *ri2)

{
  undefined4 uVar1;
  long lVar2;
  undefined7 in_register_00000039;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000039,rtype) << 4);
  uVar1 = *(undefined4 *)((long)&convert->bpos + uVar3);
  ri1->bpos = (short)uVar1;
  ri1->bsiz = (short)((uint)uVar1 >> 0x10);
  lVar2 = *(long *)((long)&convert->mask + uVar3);
  ri1->mask = lVar2;
  if (lVar2 == 0) {
    ppc32_reloc_elf2vlink::ri2.next = (RelocInsert *)0x0;
    ppc32_reloc_elf2vlink::ri2.bpos = 0;
    ppc32_reloc_elf2vlink::ri2.bsiz = 0;
    ppc32_reloc_elf2vlink::ri2._12_4_ = 0;
    ri1->next = &ppc32_reloc_elf2vlink::ri2;
    ri1->mask = 0xffff0000;
    ppc32_reloc_elf2vlink::ri2.bsiz = 0x10;
    ppc32_reloc_elf2vlink::ri2.mask = 0x8000;
  }
  return (&convert->rtype)[uVar3];
}

Assistant:

static uint8_t setupRI(uint8_t rtype,struct ELF2vlink *convert,
                       struct RelocInsert *ri1,struct RelocInsert *ri2)
{
  ri1->bpos = convert[rtype].bpos;
  ri1->bsiz = convert[rtype].bsiz;
  if ((ri1->mask = convert[rtype].mask) == 0) {
    /* @ha mode - add a second RelocInsert */
    memset(ri2,0,sizeof(struct RelocInsert));
    ri1->next = ri2;
    ri1->mask = 0xffff0000;
    ri2->bsiz = 16;
    ri2->mask = 0x8000;
  }
  return convert[rtype].rtype;
}